

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode JsDiagSetStepType(JsDiagStepType stepType)

{
  ScriptContext *scriptContext;
  JsrtRuntime *this;
  DebugManager *pDVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *pJVar4;
  JsrtDebugManager *this_00;
  PAL_FILE *pPVar5;
  ScriptContext *__localScriptContext;
  BREAKRESUMEACTION resumeAction;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_60 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar4 = JsrtContext::GetCurrent();
  JVar3 = CheckContext(pJVar4,true,false);
  if (JVar3 != JsNoError) {
    return JVar3;
  }
  scriptContext = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_98 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_60,scriptContext,(ScriptEntryExitRecord *)auStack_98,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_60);
  pJVar4 = JsrtContext::GetCurrent();
  this = (pJVar4->runtime).ptr;
  pDVar1 = this->threadContext->debugManager;
  JVar3 = JsErrorDiagNotAtBreak;
  if ((pDVar1 != (DebugManager *)0x0) && (pDVar1->isAtDispatchHalt == true)) {
    this_00 = JsrtRuntime::GetJsrtDebugManager(this);
    JVar3 = JsErrorDiagNotInDebugMode;
    if ((this_00 != (JsrtDebugManager *)0x0) &&
       (bVar2 = JsrtDebugManager::IsDebugEventCallbackSet(this_00), bVar2)) {
      JVar3 = JsNoError;
      switch(stepType) {
      case JsDiagStepTypeStepIn:
        resumeAction = BREAKRESUMEACTION_STEP_INTO;
        break;
      case JsDiagStepTypeStepOut:
        resumeAction = BREAKRESUMEACTION_STEP_OUT;
        break;
      case JsDiagStepTypeStepOver:
        resumeAction = BREAKRESUMEACTION_STEP_OVER;
        break;
      case JsDiagStepTypeStepBack:
        if (this->threadContext->TTDLog == (EventLog *)0x0) {
          pPVar5 = PAL_get_stderr(0);
          resumeAction = BREAKRESUMEACTION_STEP_OVER;
          PAL_fprintf(pPVar5,
                      "Must be in replay mode to use reverse-step - launch with \"--replay-debug\" flag in Node."
                     );
        }
        else {
          resumeAction = BREAKRESUMEACTION_CONTINUE;
          TTD::ExecutionInfoManager::SetPendingTTDStepBackMove
                    (this->threadContext->TTDExecutionInfo);
        }
        break;
      case JsDiagStepTypeReverseContinue:
        if (this->threadContext->TTDLog == (EventLog *)0x0) {
          pPVar5 = PAL_get_stderr(0);
          resumeAction = BREAKRESUMEACTION_CONTINUE;
          PAL_fprintf(pPVar5,
                      "Must be in replay mode to use reverse-continue - launch with \"--replay-debug\" flag in Node."
                     );
        }
        else {
          resumeAction = BREAKRESUMEACTION_CONTINUE;
          TTD::ExecutionInfoManager::SetPendingTTDReverseContinueMove
                    (this->threadContext->TTDExecutionInfo,0x10);
        }
        break;
      case JsDiagStepTypeContinue:
        resumeAction = BREAKRESUMEACTION_CONTINUE;
        break;
      default:
        goto switchD_003b20c1_default;
      }
      JsrtDebugManager::SetResumeType(this_00,resumeAction);
    }
  }
switchD_003b20c1_default:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_60);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  return JVar3;
}

Assistant:

CHAKRA_API JsDiagSetStepType(
    _In_ JsDiagStepType stepType)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<true>([&](Js::ScriptContext * scriptContext) -> JsErrorCode {

        JsrtContext *currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        VALIDATE_RUNTIME_IS_AT_BREAK(runtime);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        if (stepType == JsDiagStepTypeStepIn)
        {
            jsrtDebugManager->SetResumeType(BREAKRESUMEACTION_STEP_INTO);
        }
        else if (stepType == JsDiagStepTypeStepOut)
        {
           jsrtDebugManager->SetResumeType(BREAKRESUMEACTION_STEP_OUT);
        }
        else if (stepType == JsDiagStepTypeStepOver)
        {
            jsrtDebugManager->SetResumeType(BREAKRESUMEACTION_STEP_OVER);
        }
        else if (stepType == JsDiagStepTypeStepBack)
        {
#if ENABLE_TTD
            ThreadContext* threadContext = runtime->GetThreadContext();
            if(!threadContext->IsRuntimeInTTDMode())
            {
                //Don't want to fail hard when user accidentally clicks this so pring message and step forward
                fprintf(stderr, "Must be in replay mode to use reverse-step - launch with \"--replay-debug\" flag in Node.");
                jsrtDebugManager->SetResumeType(BREAKRESUMEACTION_STEP_OVER);
            }
            else
            {
                threadContext->TTDExecutionInfo->SetPendingTTDStepBackMove();

                //don't worry about BP suppression because we are just going to throw after we return
                jsrtDebugManager->SetResumeType(BREAKRESUMEACTION_CONTINUE);
            }
#else
            return JsErrorInvalidArgument;
#endif
        }
        else if (stepType == JsDiagStepTypeReverseContinue)
        {
#if ENABLE_TTD
            ThreadContext* threadContext = runtime->GetThreadContext();
            if(!threadContext->IsRuntimeInTTDMode())
            {
                //Don't want to fail hard when user accidentally clicks this so pring message and step forward
                fprintf(stderr, "Must be in replay mode to use reverse-continue - launch with \"--replay-debug\" flag in Node.");
                jsrtDebugManager->SetResumeType(BREAKRESUMEACTION_CONTINUE);
            }
            else
            {
                threadContext->TTDExecutionInfo->SetPendingTTDReverseContinueMove(JsTTDMoveMode::JsTTDMoveScanIntervalForContinue);

                //don't worry about BP suppression because we are just going to throw after we return
                jsrtDebugManager->SetResumeType(BREAKRESUMEACTION_CONTINUE);
            }
#else
            return JsErrorInvalidArgument;
#endif
        }
        else if (stepType == JsDiagStepTypeContinue)
        {
            jsrtDebugManager->SetResumeType(BREAKRESUMEACTION_CONTINUE);
        }

        return JsNoError;
    });
#endif
}